

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setSubData
          (Texture *this,ConstPixelBufferAccess *src,int xOff,int yOff,int width,int height)

{
  int iVar1;
  deUint32 target;
  TransferFormat TVar2;
  byte bVar3;
  int face;
  CubeFace face_00;
  int level;
  int iVar4;
  int iVar5;
  
  TVar2 = glu::getTransferFormat(src->m_format);
  iVar1 = computePixelStore(&src->m_format);
  glwPixelStorei(0xcf5,iVar1);
  if (this->m_type == TEXTURETYPE_CUBE) {
    glwBindTexture(0x8513,this->m_textureGL);
    for (iVar1 = 0; iVar1 < this->m_numMipLevels; iVar1 = iVar1 + 1) {
      bVar3 = (byte)iVar1;
      iVar4 = width >> (bVar3 & 0x1f);
      if (iVar4 < 2) {
        iVar4 = 1;
      }
      iVar5 = height >> (bVar3 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      for (face_00 = CUBEFACE_NEGATIVE_X; face_00 != CUBEFACE_LAST;
          face_00 = face_00 + CUBEFACE_POSITIVE_X) {
        target = cubeFaceToGLFace(face_00);
        glwTexSubImage2D(target,iVar1,xOff >> (bVar3 & 0x1f),yOff >> (bVar3 & 0x1f),iVar4,iVar5,
                         TVar2.format,TVar2.dataType,src->m_data);
      }
    }
  }
  else if (this->m_type == TEXTURETYPE_2D) {
    glwBindTexture(0xde1,this->m_textureGL);
    for (iVar1 = 0; iVar1 < this->m_numMipLevels; iVar1 = iVar1 + 1) {
      bVar3 = (byte)iVar1;
      iVar4 = width >> (bVar3 & 0x1f);
      if (iVar4 < 2) {
        iVar4 = 1;
      }
      iVar5 = height >> (bVar3 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      glwTexSubImage2D(0xde1,iVar1,xOff >> (bVar3 & 0x1f),yOff >> (bVar3 & 0x1f),iVar4,iVar5,
                       TVar2.format,TVar2.dataType,src->m_data);
    }
  }
  return;
}

Assistant:

void Texture::setSubData (const ConstPixelBufferAccess& src, const int xOff, const int yOff, const int width, const int height) const
{
	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(m_internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
			glTexSubImage2D(GL_TEXTURE_2D, level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexSubImage2D(cubeFaceToGLFace((CubeFace)face), level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}